

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O0

int __thiscall
deqp::gls::LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::
computeApproxMemUsage(GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer> *this)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  reference this_00;
  Buffer *pBVar4;
  __normal_iterator<const_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_*,_std::vector<de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>,_std::allocator<de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>_>
  local_38;
  __normal_iterator<const_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_*,_std::vector<de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>,_std::allocator<de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>_>
  local_30;
  const_iterator it_1;
  _Self local_20;
  const_iterator it;
  int result;
  GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer> *this_local;
  
  it._M_node._4_4_ = 0;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>_>
       ::begin(&this->m_objects);
  while( true ) {
    it_1._M_current =
         (SharedPtr<deqp::gls::LongStressCaseInternal::Buffer> *)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>_>
         ::end(&this->m_objects);
    bVar1 = std::operator!=(&local_20,(_Self *)&it_1);
    if (!bVar1) break;
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>
             ::operator->(&local_20);
    pBVar4 = de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>::operator->(&ppVar3->second);
    iVar2 = LongStressCaseInternal::Buffer::getApproxMemUsage(pBVar4);
    it._M_node._4_4_ = iVar2 + it._M_node._4_4_;
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>
    ::operator++(&local_20);
  }
  local_30._M_current =
       (SharedPtr<deqp::gls::LongStressCaseInternal::Buffer> *)
       std::
       vector<de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>,_std::allocator<de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>
       ::begin(&this->m_garbageObjects);
  while( true ) {
    local_38._M_current =
         (SharedPtr<deqp::gls::LongStressCaseInternal::Buffer> *)
         std::
         vector<de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>,_std::allocator<de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>
         ::end(&this->m_garbageObjects);
    bVar1 = __gnu_cxx::operator!=(&local_30,&local_38);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_*,_std::vector<de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>,_std::allocator<de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>_>
              ::operator*(&local_30);
    pBVar4 = de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>::operator->(this_00);
    iVar2 = LongStressCaseInternal::Buffer::getApproxMemUsage(pBVar4);
    it._M_node._4_4_ = iVar2 + it._M_node._4_4_;
    __gnu_cxx::
    __normal_iterator<const_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_*,_std::vector<de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>,_std::allocator<de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>_>
    ::operator++(&local_30);
  }
  return it._M_node._4_4_;
}

Assistant:

int GLObjectManager<T>::computeApproxMemUsage (void) const
{
	int result = 0;

	for (typename map<string, SharedPtr<T> >::const_iterator it = m_objects.begin(); it != m_objects.end(); ++it)
		result += it->second->getApproxMemUsage();

	for (typename vector<SharedPtr<T> >::const_iterator it = m_garbageObjects.begin(); it != m_garbageObjects.end(); ++it)
		result += (*it)->getApproxMemUsage();

	return result;
}